

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O3

Matrix3f * Matrix3f::rotation(Matrix3f *__return_storage_ptr__,Quat4f *rq)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  Quat4f q;
  Quat4f local_20;
  
  Quat4f::normalized(rq);
  fVar5 = Quat4f::x(&local_20);
  fVar6 = Quat4f::x(&local_20);
  fVar7 = Quat4f::y(&local_20);
  fVar8 = Quat4f::y(&local_20);
  fVar9 = Quat4f::z(&local_20);
  fVar10 = Quat4f::z(&local_20);
  fVar11 = Quat4f::x(&local_20);
  fVar12 = Quat4f::y(&local_20);
  fVar13 = Quat4f::z(&local_20);
  fVar14 = Quat4f::w(&local_20);
  fVar15 = Quat4f::x(&local_20);
  fVar16 = Quat4f::z(&local_20);
  fVar17 = Quat4f::y(&local_20);
  fVar18 = Quat4f::w(&local_20);
  fVar19 = Quat4f::y(&local_20);
  fVar20 = Quat4f::z(&local_20);
  fVar21 = Quat4f::x(&local_20);
  fVar22 = Quat4f::w(&local_20);
  fVar2 = fVar12 * fVar11 - fVar14 * fVar13;
  fVar1 = fVar16 * fVar15 + fVar18 * fVar17;
  fVar11 = fVar14 * fVar13 + fVar12 * fVar11;
  fVar13 = fVar16 * fVar15 - fVar18 * fVar17;
  fVar14 = fVar20 * fVar19 - fVar22 * fVar21;
  fVar12 = fVar20 * fVar19 + fVar22 * fVar21;
  auVar23 = SUB6416(ZEXT464(0x3f800000),0);
  auVar24 = SUB6416(ZEXT464(0xc0000000),0);
  auVar3 = vfmadd213ss_fma(ZEXT416((uint)(fVar8 * fVar7 + fVar10 * fVar9)),auVar24,auVar23);
  auVar4 = vfmadd213ss_fma(ZEXT416((uint)(fVar6 * fVar5 + fVar10 * fVar9)),auVar24,auVar23);
  auVar23 = vfmadd213ss_fma(ZEXT416((uint)(fVar6 * fVar5 + fVar8 * fVar7)),auVar24,auVar23);
  __return_storage_ptr__->m_elements[0] = auVar3._0_4_;
  __return_storage_ptr__->m_elements[1] = fVar11 + fVar11;
  __return_storage_ptr__->m_elements[2] = fVar13 + fVar13;
  __return_storage_ptr__->m_elements[3] = fVar2 + fVar2;
  __return_storage_ptr__->m_elements[4] = auVar4._0_4_;
  __return_storage_ptr__->m_elements[5] = fVar12 + fVar12;
  __return_storage_ptr__->m_elements[6] = fVar1 + fVar1;
  __return_storage_ptr__->m_elements[7] = fVar14 + fVar14;
  __return_storage_ptr__->m_elements[8] = auVar23._0_4_;
  return __return_storage_ptr__;
}

Assistant:

Matrix3f Matrix3f::rotation( const Quat4f& rq )
{
	Quat4f q = rq.normalized();

	float xx = q.x() * q.x();
	float yy = q.y() * q.y();
	float zz = q.z() * q.z();

	float xy = q.x() * q.y();
	float zw = q.z() * q.w();

	float xz = q.x() * q.z();
	float yw = q.y() * q.w();

	float yz = q.y() * q.z();
	float xw = q.x() * q.w();

	return Matrix3f
		(
			1.0f - 2.0f * ( yy + zz ),		2.0f * ( xy - zw ),				2.0f * ( xz + yw ),
			2.0f * ( xy + zw ),				1.0f - 2.0f * ( xx + zz ),		2.0f * ( yz - xw ),
			2.0f * ( xz - yw ),				2.0f * ( yz + xw ),				1.0f - 2.0f * ( xx + yy )
		);
}